

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O0

Polynomial<double> __thiscall gmath::Polynomial<double>::operator-(Polynomial<double> *this)

{
  double *extraout_RDX;
  double *pdVar1;
  long in_RSI;
  Polynomial<double> *in_RDI;
  Polynomial<double> PVar2;
  int i;
  Polynomial<double> *ret;
  Polynomial<double> *pPVar3;
  int local_28;
  int in_stack_ffffffffffffffdc;
  Polynomial<double> *in_stack_ffffffffffffffe0;
  
  pPVar3 = in_RDI;
  Polynomial(in_RDI);
  increase(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  in_RDI->used = *(int *)(in_RSI + 4);
  pdVar1 = extraout_RDX;
  for (local_28 = 0; local_28 < *(int *)(in_RSI + 4); local_28 = local_28 + 1) {
    pdVar1 = (double *)0x8000000000000000;
    in_RDI->c[local_28] = -*(double *)(*(long *)(in_RSI + 8) + (long)local_28 * 8);
  }
  PVar2.c = pdVar1;
  PVar2._0_8_ = pPVar3;
  return PVar2;
}

Assistant:

Polynomial<T> operator-() const
    {
      Polynomial<T> ret;

      ret.increase(used);
      ret.used=used;

      for (int i=0; i<used; i++)
      {
        ret.c[i]=-c[i];
      }

      return ret;
    }